

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Program.cpp
# Opt level: O2

bool llvm::sys::commandLineFitsWithinSystemLimits(StringRef Program,ArrayRef<const_char_*> Args)

{
  bool bVar1;
  long lVar2;
  SmallVectorImpl<llvm::StringRef> *pSVar3;
  ArrayRef<llvm::StringRef> Args_00;
  StringRef Program_00;
  char *A;
  SmallVector<llvm::StringRef,_8U> StringRefArgs;
  char *local_c8;
  SmallVectorImpl<llvm::StringRef> local_c0;
  undefined1 local_b0 [128];
  
  Program_00.Length = Program.Length;
  local_c0.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX = local_b0;
  local_c0.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size = 0;
  local_c0.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Capacity = 8;
  pSVar3 = &local_c0;
  SmallVectorImpl<llvm::StringRef>::reserve(&local_c0,Args.Length);
  for (lVar2 = 0; Args.Length << 3 != lVar2; lVar2 = lVar2 + 8) {
    local_c8 = *(char **)((long)Args.Data + lVar2);
    pSVar3 = &local_c0;
    SmallVectorImpl<llvm::StringRef>::emplace_back<char_const*&>(&local_c0,&local_c8);
  }
  Args_00.Length._0_4_ =
       local_c0.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
       super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size;
  Args_00.Data = (StringRef *)
                 local_c0.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                 super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX
  ;
  Args_00.Length._4_4_ = 0;
  Program_00.Data = (char *)pSVar3;
  bVar1 = commandLineFitsWithinSystemLimits(Program_00,Args_00);
  SmallVectorImpl<llvm::StringRef>::~SmallVectorImpl(&local_c0);
  return bVar1;
}

Assistant:

bool sys::commandLineFitsWithinSystemLimits(StringRef Program,
                                            ArrayRef<const char *> Args) {
  SmallVector<StringRef, 8> StringRefArgs;
  StringRefArgs.reserve(Args.size());
  for (const char *A : Args)
    StringRefArgs.emplace_back(A);
  return commandLineFitsWithinSystemLimits(Program, StringRefArgs);
}